

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dynamics.cc
# Opt level: O0

void RigidBodyDynamics::NonlinearEffects(Model *model,VectorNd *Q,VectorNd *QDot,VectorNd *Tau)

{
  Scalar *pSVar1;
  size_type sVar2;
  ulong uVar3;
  reference pvVar4;
  reference pvVar5;
  reference pvVar6;
  Scalar *pSVar7;
  vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *this;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_RCX;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *in_RDI;
  ReturnType RVar8;
  uint i_2;
  uint i_1;
  uint i;
  SpatialVector spatial_gravity;
  VectorNd *in_stack_00000640;
  VectorNd *in_stack_00000648;
  uint in_stack_00000654;
  Model *in_stack_00000658;
  Index in_stack_fffffffffffffc48;
  MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
  *other;
  DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffc50;
  reference in_stack_fffffffffffffc58;
  DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *in_stack_fffffffffffffc60;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffc70;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *in_stack_fffffffffffffc78;
  double *in_stack_fffffffffffffca8;
  pointer *ppuVar9;
  double *in_stack_fffffffffffffcb0;
  double *in_stack_fffffffffffffcb8;
  double *in_stack_fffffffffffffcc0;
  double *in_stack_fffffffffffffcc8;
  SpatialVector_t *in_stack_fffffffffffffcd0;
  double *in_stack_fffffffffffffce0;
  undefined1 in_stack_fffffffffffffd80 [16];
  uint local_26c;
  SpatialVector *in_stack_fffffffffffffe10;
  SpatialTransform *in_stack_fffffffffffffe18;
  SpatialVector *in_stack_fffffffffffffe70;
  SpatialRigidBodyInertia *in_stack_fffffffffffffe78;
  uint local_90;
  uint local_8c;
  Scalar local_88;
  Scalar local_80;
  Scalar local_78;
  undefined8 local_70;
  undefined8 local_68;
  undefined8 local_60;
  MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *local_20;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *local_8;
  
  local_60 = 0;
  local_68 = 0;
  local_70 = 0;
  local_20 = in_RCX;
  local_8 = in_RDI;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_78 = -*pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_80 = -*pSVar1;
  pSVar1 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1>::operator[]
                     ((DenseCoeffsBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_1> *)
                      in_stack_fffffffffffffc50,in_stack_fffffffffffffc48);
  local_88 = -*pSVar1;
  other = (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_const_Eigen::Matrix<double,_6,_1,_0,_6,_1>_>_>
           *)&local_88;
  SpatialVector_t::SpatialVector_t
            (in_stack_fffffffffffffcd0,in_stack_fffffffffffffcc8,in_stack_fffffffffffffcc0,
             in_stack_fffffffffffffcb8,in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8,
             in_stack_fffffffffffffce0);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffc50);
  std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
            ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
             &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,0);
  SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffc50,(SpatialVector_t *)other);
  for (local_8c = 1;
      sVar2 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                        ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                         &local_8[0xb].
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage), local_8c < sVar2;
      local_8c = local_8c + 1) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
               &local_8[0xb].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                .super__Vector_impl_data._M_end_of_storage,(ulong)local_8c);
    jcalc(in_stack_00000658,in_stack_00000654,in_stack_00000648,in_stack_00000640);
  }
  local_90 = 1;
  while( true ) {
    uVar3 = (ulong)local_90;
    sVar2 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
            ::size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                    *)&local_8[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
    if (sVar2 <= uVar3) break;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_8,(ulong)local_90);
    if (*pvVar4 == 0) {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffc50,(SpatialVector_t *)other);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1d),(ulong)local_90);
      Math::SpatialTransform::apply(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=
                ((SpatialVector_t *)in_stack_fffffffffffffc50,(SpatialVector_t *)other);
    }
    else {
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1d),(ulong)local_90);
      ppuVar9 = &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)ppuVar9,
                 (ulong)*pvVar4);
      Math::SpatialTransform::apply(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffc50,other);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[10].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[9].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Math::crossm(in_stack_fffffffffffffd80._8_8_,in_stack_fffffffffffffd80._0_8_);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffc50,other);
      std::
      vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                    *)(local_8 + 0x1d),(ulong)local_90);
      ppuVar9 = &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)ppuVar9,
                 (ulong)*pvVar4);
      Math::SpatialTransform::apply(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[0x13].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffc50,other);
    }
    pvVar5 = std::
             vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
             operator[]((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                         *)&local_8[0x20].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_finish,(ulong)local_90);
    if ((pvVar5->mIsVirtual & 1U) == 0) {
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(local_8 + 0x1a),(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[5].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      std::
      vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
      ::operator[]((vector<RigidBodyDynamics::Math::SpatialRigidBodyInertia,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialRigidBodyInertia>_>
                    *)(local_8 + 0x1a),(ulong)local_90);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 &local_8[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                  .super__Vector_impl_data._M_end_of_storage,(ulong)local_90);
      Math::SpatialRigidBodyInertia::operator*(in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      Math::crossf(in_stack_fffffffffffffd80._8_8_,in_stack_fffffffffffffd80._0_8_);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x19),(ulong)local_90);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffc50,other);
    }
    else {
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x19),(ulong)local_90);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_>::setZero(in_stack_fffffffffffffc50);
    }
    local_90 = local_90 + 1;
  }
  sVar2 = std::vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>::
          size((vector<RigidBodyDynamics::Body,_Eigen::aligned_allocator<RigidBodyDynamics::Body>_>
                *)&local_8[0x20].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                   _M_impl.super__Vector_impl_data._M_finish);
  local_26c = (uint)sVar2;
  while (local_26c = local_26c - 1, local_26c != 0) {
    pvVar6 = std::
             vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
             operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                         *)&local_8[6].
                            super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(ulong)local_26c);
    if (pvVar6->mDoFCount == 3) {
      std::
      vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
      ::operator[]((vector<Eigen::Matrix<double,_6,_3,_0,_6,_3>,_Eigen::aligned_allocator<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_>
                    *)&local_8[0xe].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_26c);
      Eigen::DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>::transpose
                ((DenseBase<Eigen::Matrix<double,_6,_3,_0,_6,_3>_> *)other);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x19),(ulong)local_26c);
      Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,6,3,0,6,3>>>::operator*
                ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>_> *)
                 in_stack_fffffffffffffc50,
                 (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)other);
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)&local_8[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_26c);
      Eigen::DenseBase<Eigen::Matrix<double,-1,1,0,-1,1>>::block<3,1>
                (in_stack_fffffffffffffc60,(Index)in_stack_fffffffffffffc58,
                 (Index)in_stack_fffffffffffffc50);
      Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,3,1,false>::operator=
                ((Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_3,_1,_false> *)
                 in_stack_fffffffffffffc50,
                 (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_6,_3,_0,_6,_3>_>,_Eigen::Matrix<double,_6,_1,_0,_6,_1>,_0>_>
                  *)other);
    }
    else {
      in_stack_fffffffffffffc70 =
           (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      &local_8[7].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_26c);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x19),(ulong)local_26c);
      RVar8 = Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::
              dot<Eigen::Matrix<double,6,1,0,6,1>>
                        ((MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)
                         in_stack_fffffffffffffc50,
                         (MatrixBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)other);
      in_stack_fffffffffffffc78 = local_20;
      std::vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>::
      operator[]((vector<RigidBodyDynamics::Joint,_Eigen::aligned_allocator<RigidBodyDynamics::Joint>_>
                  *)&local_8[6].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_end_of_storage,(ulong)local_26c);
      pSVar7 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_1>::operator[]
                         ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_1> *)
                          in_stack_fffffffffffffc50,(Index)other);
      *pSVar7 = RVar8;
    }
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       (local_8,(ulong)local_26c);
    if (*pvVar4 != 0) {
      in_stack_fffffffffffffc50 =
           (DenseBase<Eigen::Matrix<double,_6,_1,_0,_6,_1>_> *)(local_8 + 0x19);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_26c);
      in_stack_fffffffffffffc60 =
           (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)
           std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                     ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                      in_stack_fffffffffffffc50,(ulong)*pvVar4);
      in_stack_fffffffffffffc58 =
           std::
           vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
           ::operator[]((vector<RigidBodyDynamics::Math::SpatialTransform,_Eigen::aligned_allocator<RigidBodyDynamics::Math::SpatialTransform>_>
                         *)(local_8 + 0x1d),(ulong)local_26c);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                ((vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)
                 (local_8 + 0x19),(ulong)local_26c);
      Math::SpatialTransform::applyTranspose(in_stack_fffffffffffffe18,in_stack_fffffffffffffe10);
      Eigen::MatrixBase<Eigen::Matrix<double,6,1,0,6,1>>::operator+
                (in_stack_fffffffffffffc78,in_stack_fffffffffffffc70);
      this = (vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_> *)(local_8 + 0x19)
      ;
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                         (local_8,(ulong)local_26c);
      std::vector<SpatialVector_t,_Eigen::aligned_allocator<SpatialVector_t>_>::operator[]
                (this,(ulong)*pvVar4);
      SpatialVector_t::operator=((SpatialVector_t *)in_stack_fffffffffffffc50,other);
    }
  }
  return;
}

Assistant:

RBDL_DLLAPI
void NonlinearEffects (
		Model &model,
		const VectorNd &Q,
		const VectorNd &QDot,
		VectorNd &Tau
		) {
	LOG << "-------- " << __func__ << " --------" << std::endl;

	SpatialVector spatial_gravity (0., 0., 0., -model.gravity[0], -model.gravity[1], -model.gravity[2]);

	// Reset the velocity of the root body
	model.v[0].setZero();
	model.a[0] = spatial_gravity;

	for (unsigned int i = 1; i < model.mJointUpdateOrder.size(); i++) {
		jcalc (model, model.mJointUpdateOrder[i], Q, QDot);
	}

	for (unsigned int i = 1; i < model.mBodies.size(); i++) {
		if (model.lambda[i] == 0) {
			model.v[i] = model.v_J[i];
			model.a[i] = model.X_lambda[i].apply(spatial_gravity);
		}	else {
			model.v[i] = model.X_lambda[i].apply(model.v[model.lambda[i]]) + model.v_J[i];
			model.c[i] = model.c_J[i] + crossm(model.v[i],model.v_J[i]);
			model.a[i] = model.X_lambda[i].apply(model.a[model.lambda[i]]) + model.c[i];
		}

		if (!model.mBodies[i].mIsVirtual) {
			model.f[i] = model.I[i] * model.a[i] + crossf(model.v[i],model.I[i] * model.v[i]);
		} else {
			model.f[i].setZero();
		}
	}

	for (unsigned int i = model.mBodies.size() - 1; i > 0; i--) {
		if (model.mJoints[i].mDoFCount == 3) {
			Tau.block<3,1>(model.mJoints[i].q_index, 0) = model.multdof3_S[i].transpose() * model.f[i];
		} else {
			Tau[model.mJoints[i].q_index] = model.S[i].dot(model.f[i]);
		}

		if (model.lambda[i] != 0) {
			model.f[model.lambda[i]] = model.f[model.lambda[i]] + model.X_lambda[i].applyTranspose(model.f[i]);
		}
	}
}